

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_service_helpers(t_swift_generator *this,t_service *tservice)

{
  t_struct *ptVar1;
  pointer pptVar2;
  pointer pptVar3;
  t_swift_generator *this_00;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string qname;
  t_struct qname_ts;
  
  this_00 = (t_swift_generator *)&tservice->functions_;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            (&functions,(vector<t_function_*,_std::allocator<t_function_*>_> *)this_00);
  for (pptVar2 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar2 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    ptVar1 = (*pptVar2)->arglist_;
    function_args_helper_struct_type_abi_cxx11_(&qname,this_00,tservice,*pptVar2);
    t_struct::t_struct(&qname_ts,(ptVar1->super_t_type).program_,&qname);
    for (pptVar3 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar3 !=
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
      t_struct::append(&qname_ts,*pptVar3);
    }
    generate_swift_struct(this,(ostream *)&this->f_impl_,&qname_ts,true);
    generate_swift_struct_implementation(this,(ostream *)&this->f_impl_,&qname_ts,false,true);
    this_00 = (t_swift_generator *)tservice;
    generate_function_helpers(this,tservice,*pptVar2);
    t_struct::~t_struct(&qname_ts);
    std::__cxx11::string::~string((string *)&qname);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {

    t_struct* ts = (*f_iter)->get_arglist();

    string qname = function_args_helper_struct_type(tservice, *f_iter);

    t_struct qname_ts = t_struct(ts->get_program(), qname);

    const vector<t_field*>& members = ts->get_members();
    vector<t_field*>::const_iterator m_iter;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      qname_ts.append(*m_iter);
    }

    generate_swift_struct(f_impl_, &qname_ts, true);
    generate_swift_struct_implementation(f_impl_, &qname_ts, false, true);
    generate_function_helpers(tservice, *f_iter);
  }
}